

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

void boost::filesystem::detail::last_write_time(path *p,time_t new_time,error_code *ec)

{
  bool bVar1;
  int iVar2;
  value_type *pvVar3;
  int *piVar4;
  err_t local_c4;
  undefined1 local_c0 [8];
  utimbuf buf;
  stat path_stat;
  error_code *ec_local;
  time_t new_time_local;
  path *p_local;
  
  pvVar3 = filesystem::path::c_str(p);
  iVar2 = stat64(pvVar3,(stat64 *)&buf.modtime);
  bVar1 = anon_unknown.dwarf_522f::error
                    ((uint)(iVar2 != 0),p,ec,"boost::filesystem::last_write_time");
  if (!bVar1) {
    buf.actime = new_time;
    pvVar3 = filesystem::path::c_str(p);
    iVar2 = utime(pvVar3,(utimbuf *)local_c0);
    if (iVar2 == 0) {
      local_c4 = 0;
    }
    else {
      piVar4 = __errno_location();
      local_c4 = *piVar4;
    }
    anon_unknown.dwarf_522f::error(local_c4,p,ec,"boost::filesystem::last_write_time");
  }
  return;
}

Assistant:

BOOST_FILESYSTEM_DECL
  void last_write_time(const path& p, const std::time_t new_time,
                        system::error_code* ec)
  {
#   ifdef BOOST_POSIX_API

    struct stat path_stat;
    if (error(::stat(p.c_str(), &path_stat)!= 0,
      p, ec, "boost::filesystem::last_write_time"))
        return;
    ::utimbuf buf;
    buf.actime = path_stat.st_atime; // utime()updates access time too:-(
    buf.modtime = new_time;
    error(::utime(p.c_str(), &buf)!= 0 ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::last_write_time");

#   else

    handle_wrapper hw(
      create_file_handle(p.c_str(), FILE_WRITE_ATTRIBUTES,
        FILE_SHARE_DELETE | FILE_SHARE_READ | FILE_SHARE_WRITE, 0,
        OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0));

    if (error(hw.handle == INVALID_HANDLE_VALUE ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::last_write_time"))
        return;

    FILETIME lwt;
    to_FILETIME(new_time, lwt);

    error(::SetFileTime(hw.handle, 0, 0, &lwt)== 0 ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::last_write_time");
#   endif
  }